

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::sse42::VirtualCurveIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  byte bVar1;
  BVH *bvh;
  size_t sVar2;
  void *pvVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  vbool<4> vVar11;
  char cVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  undefined4 uVar16;
  AABBNodeMB4D *node1;
  uint uVar17;
  ulong uVar18;
  RayQueryContext *pRVar19;
  RayQueryContext *pRVar20;
  RayQueryContext *extraout_RDX;
  NodeRef root;
  size_t sVar21;
  Intersectors *pIVar22;
  ulong uVar23;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar24;
  NodeRef *pNVar25;
  int iVar26;
  float fVar27;
  float fVar28;
  float fVar46;
  float fVar47;
  vint4 ai;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar48;
  float fVar49;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar50;
  float fVar55;
  float fVar56;
  vint4 ai_3;
  undefined1 auVar51 [16];
  float fVar57;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar54;
  float fVar58;
  float fVar59;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  vint4 bi_3;
  float fVar65;
  float fVar66;
  undefined1 auVar60 [16];
  float fVar67;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar68 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  vint4 ai_1;
  float fVar79;
  float fVar80;
  float fVar82;
  float fVar83;
  vint4 bi;
  undefined1 auVar81 [16];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar88;
  float fVar89;
  vint4 bi_1;
  undefined1 auVar87 [16];
  uint uVar90;
  uint uVar91;
  vint4 ai_2;
  uint uVar92;
  uint uVar93;
  uint uVar94;
  uint uVar95;
  vint4 bi_2;
  uint uVar96;
  uint uVar97;
  uint uVar101;
  uint uVar102;
  vfloat4 a0;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  uint uVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  vint4 ai_15;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar118;
  float fVar119;
  uint uVar120;
  uint uVar122;
  uint uVar123;
  vint4 bi_10;
  undefined1 auVar121 [16];
  uint uVar124;
  vint4 ai_13;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar127;
  undefined1 auVar128 [16];
  float fVar129;
  float fVar130;
  TravRayK<4,_true> *tray_00;
  undefined8 local_1958;
  undefined8 uStack_1950;
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_true> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar10 = mm_lookupmask_ps._8_8_;
  uVar9 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  sVar21 = (bvh->root).ptr;
  if (sVar21 != 8) {
    auVar81 = *(undefined1 (*) [16])(ray + 0x80);
    auVar68._0_12_ = ZEXT812(0);
    auVar68._12_4_ = 0;
    auVar51._0_4_ = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar81._0_4_);
    auVar51._4_4_ = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar81._4_4_);
    auVar51._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar81._8_4_);
    auVar51._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar81._12_4_);
    uVar17 = movmskps((int)context,auVar51);
    if (uVar17 != 0) {
      uVar18 = (ulong)(uVar17 & 0xff);
      pRVar20 = (RayQueryContext *)pre.ray_space;
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      fVar67 = tray.dir.field_0._0_4_;
      fVar69 = tray.dir.field_0._4_4_;
      fVar71 = tray.dir.field_0._8_4_;
      fVar73 = tray.dir.field_0._12_4_;
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      fVar58 = tray.dir.field_0._16_4_;
      fVar61 = tray.dir.field_0._20_4_;
      fVar63 = tray.dir.field_0._24_4_;
      fVar65 = tray.dir.field_0._28_4_;
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar50 = tray.dir.field_0._32_4_;
      fVar55 = tray.dir.field_0._36_4_;
      fVar56 = tray.dir.field_0._40_4_;
      fVar57 = tray.dir.field_0._44_4_;
      auVar87._0_4_ = fVar58 * fVar58 + fVar50 * fVar50;
      auVar87._4_4_ = fVar61 * fVar61 + fVar55 * fVar55;
      auVar87._8_4_ = fVar63 * fVar63 + fVar56 * fVar56;
      auVar87._12_4_ = fVar65 * fVar65 + fVar57 * fVar57;
      auVar98._0_4_ = fVar67 * fVar67 + auVar87._0_4_;
      auVar98._4_4_ = fVar69 * fVar69 + auVar87._4_4_;
      auVar98._8_4_ = fVar71 * fVar71 + auVar87._8_4_;
      auVar98._12_4_ = fVar73 * fVar73 + auVar87._12_4_;
      auVar87 = rsqrtps(auVar87,auVar98);
      fVar66 = auVar87._0_4_;
      fVar27 = auVar87._4_4_;
      fVar28 = auVar87._8_4_;
      fVar46 = auVar87._12_4_;
      pre.depth_scale.field_0.v[0] = fVar66 * fVar66 * auVar98._0_4_ * -0.5 * fVar66 + fVar66 * 1.5;
      pre.depth_scale.field_0.v[1] = fVar27 * fVar27 * auVar98._4_4_ * -0.5 * fVar27 + fVar27 * 1.5;
      pre.depth_scale.field_0.v[2] = fVar28 * fVar28 * auVar98._8_4_ * -0.5 * fVar28 + fVar28 * 1.5;
      pre.depth_scale.field_0.v[3] = fVar46 * fVar46 * auVar98._12_4_ * -0.5 * fVar46 + fVar46 * 1.5
      ;
      do {
        lVar4 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        auVar98 = insertps(ZEXT416(*(uint *)(ray + lVar4 * 4 + 0x40)),
                           *(undefined4 *)(ray + lVar4 * 4 + 0x50),0x1c);
        auVar98 = insertps(auVar98,*(undefined4 *)(ray + lVar4 * 4 + 0x60),0x28);
        fVar66 = *(float *)((long)pre.ray_space + lVar4 * 4 + -0x10);
        auVar99._0_4_ = auVar98._0_4_ * fVar66;
        auVar99._4_4_ = auVar98._4_4_ * fVar66;
        auVar99._8_4_ = auVar98._8_4_ * fVar66;
        auVar99._12_4_ = auVar98._12_4_ * fVar66;
        uVar23 = CONCAT44(auVar99._4_4_,auVar99._4_4_);
        auVar29._0_8_ = uVar23 ^ 0x8000000080000000;
        auVar29._8_4_ = -auVar99._12_4_;
        auVar29._12_4_ = -auVar99._12_4_;
        auVar98 = blendps(auVar29,auVar68,0xe);
        auVar126._4_4_ = auVar98._0_4_;
        auVar126._0_4_ = auVar99._8_4_;
        auVar126._8_4_ = auVar98._4_4_;
        auVar126._12_4_ = 0;
        auVar125._4_4_ = auVar98._0_4_;
        auVar125._0_4_ = auVar99._8_4_;
        auVar125._8_4_ = auVar98._4_4_;
        auVar125._12_4_ = 0;
        auVar125 = dpps(auVar125 << 0x20,auVar126 << 0x20,0x7f);
        uVar23 = CONCAT44(auVar99._12_4_,auVar99._8_4_);
        auVar110._0_8_ = uVar23 ^ 0x8000000080000000;
        auVar110._8_4_ = -auVar99._8_4_;
        auVar110._12_4_ = -auVar99._12_4_;
        auVar87 = insertps(auVar110,auVar99,0x2a);
        auVar98 = dpps(auVar87,auVar87,0x7f);
        iVar26 = -(uint)(auVar98._0_4_ < auVar125._0_4_);
        auVar30._4_4_ = iVar26;
        auVar30._0_4_ = iVar26;
        auVar30._8_4_ = iVar26;
        auVar30._12_4_ = iVar26;
        auVar98 = blendvps(auVar87,auVar126 << 0x20,auVar30);
        auVar87 = dpps(auVar98,auVar98,0x7f);
        auVar126 = rsqrtss(auVar87,auVar87);
        fVar27 = auVar126._0_4_;
        fVar27 = fVar27 * 1.5 - fVar27 * fVar27 * auVar87._0_4_ * 0.5 * fVar27;
        fVar28 = fVar27 * auVar98._0_4_;
        fVar46 = fVar27 * auVar98._4_4_;
        fVar47 = fVar27 * auVar98._8_4_;
        fVar27 = fVar27 * auVar98._12_4_;
        fVar107 = fVar46 * auVar99._0_4_ - auVar99._4_4_ * fVar28;
        fVar112 = fVar47 * auVar99._4_4_ - auVar99._8_4_ * fVar46;
        fVar115 = fVar28 * auVar99._8_4_ - auVar99._0_4_ * fVar47;
        auVar111._12_4_ = fVar27 * auVar99._12_4_ - auVar99._12_4_ * fVar27;
        auVar111._0_8_ = CONCAT44(fVar115,fVar112);
        auVar111._8_4_ = fVar107;
        auVar121._8_4_ = fVar107;
        auVar121._0_8_ = auVar111._0_8_;
        auVar121._12_4_ = auVar111._12_4_;
        auVar98 = dpps(auVar121,auVar111,0x7f);
        pIVar22 = (Intersectors *)(uVar18 - 1);
        auVar87 = rsqrtss(auVar98,auVar98);
        fVar27 = auVar87._0_4_;
        fVar27 = fVar27 * 1.5 - fVar27 * fVar27 * auVar98._0_4_ * 0.5 * fVar27;
        aVar31.m128[1] = fVar27 * fVar107;
        aVar31.m128[0] = fVar47;
        aVar31.m128[2] = auVar99._8_4_ * fVar66;
        aVar31.m128[3] = 0.0;
        (((LinearSpace3fa *)((long)pRVar20 + lVar4 * 0x30))->vx).field_0.m128[0] = fVar28;
        pre.ray_space[lVar4].vx.field_0.m128[1] = fVar27 * fVar112;
        pre.ray_space[lVar4].vx.field_0.m128[2] = auVar99._0_4_ * fVar66;
        pre.ray_space[lVar4].vx.field_0.m128[3] = 0.0;
        aVar8.m128[1] = fVar27 * fVar115;
        aVar8.m128[0] = fVar46;
        aVar8.m128[2] = auVar99._4_4_ * fVar66;
        aVar8.m128[3] = 0.0;
        pre.ray_space[lVar4].vy.field_0 = aVar8;
        pre.ray_space[lVar4].vz.field_0 = aVar31;
        uVar18 = uVar18 & (ulong)pIVar22;
      } while (uVar18 != 0);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      auVar32._4_4_ = -(uint)(ABS(fVar69) < 1e-18);
      auVar32._0_4_ = -(uint)(ABS(fVar67) < 1e-18);
      auVar32._8_4_ = -(uint)(ABS(fVar71) < 1e-18);
      auVar32._12_4_ = -(uint)(ABS(fVar73) < 1e-18);
      auVar87 = divps(_DAT_01f7ba10,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar98 = divps(_DAT_01f7ba10,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar33._4_4_ = -(uint)(ABS(fVar61) < 1e-18);
      auVar33._0_4_ = -(uint)(ABS(fVar58) < 1e-18);
      auVar68 = divps(_DAT_01f7ba10,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar34._4_4_ = -(uint)(ABS(fVar55) < 1e-18);
      auVar34._0_4_ = -(uint)(ABS(fVar50) < 1e-18);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)blendvps(auVar87,_DAT_01fab950,auVar32);
      auVar33._8_4_ = -(uint)(ABS(fVar63) < 1e-18);
      auVar33._12_4_ = -(uint)(ABS(fVar65) < 1e-18);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)blendvps(auVar98,_DAT_01fab950,auVar33);
      auVar34._8_4_ = -(uint)(ABS(fVar56) < 1e-18);
      auVar34._12_4_ = -(uint)(ABS(fVar57) < 1e-18);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)blendvps(auVar68,_DAT_01fab950,auVar34);
      tray.nearXYZ.field_0._0_4_ = -(uint)(tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)(tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar35._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar35._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar35._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar35._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeed0,_DAT_01f8c1f0,auVar35);
      auVar36._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar36._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar36._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar36._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeef0,_DAT_01faeee0,auVar36);
      auVar68 = maxps(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0));
      auVar81 = maxps(auVar81,ZEXT816(0));
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f7a9f0,auVar68,auVar51);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f7aa00,auVar81,auVar51);
      auVar81._8_4_ = 0xffffffff;
      auVar81._0_8_ = 0xffffffffffffffff;
      auVar81._12_4_ = 0xffffffff;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar81 ^ auVar51);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar17 = 3;
      }
      else {
        uVar17 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar25 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar24 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_node[1].ptr = sVar21;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      uVar14 = 0x21d2f80;
      aVar38 = _DAT_01f7a9f0;
LAB_0023fcc0:
      do {
        do {
          root.ptr = pNVar25[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00240504;
          pNVar25 = pNVar25 + -1;
          paVar24 = paVar24 + -1;
          aVar54.v = *(__m128 *)paVar24->v;
          auVar37._4_4_ = -(uint)(aVar54.v[1] < tray.tfar.field_0.v[1]);
          auVar37._0_4_ = -(uint)(aVar54.v[0] < tray.tfar.field_0.v[0]);
          auVar37._8_4_ = -(uint)(aVar54.v[2] < tray.tfar.field_0.v[2]);
          auVar37._12_4_ = -(uint)(aVar54._12_4_ < tray.tfar.field_0.v[3]);
          uVar14 = movmskps(uVar14,auVar37);
        } while (uVar14 == 0);
        uVar18 = (ulong)(byte)uVar14;
        uVar15 = POPCOUNT(uVar14 & 0xff);
        uVar14 = uVar15;
        if (uVar17 < uVar15) {
LAB_0023fd00:
          do {
            vVar11.field_0 = terminated.field_0;
            pRVar19 = (RayQueryContext *)&DAT_fffffffffffffff0;
            fVar50 = aVar54.v[0];
            fVar55 = aVar54.v[1];
            fVar56 = aVar54.v[2];
            fVar57 = aVar54.v[3];
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00240504;
              auVar44._4_4_ = -(uint)(fVar55 < tray.tfar.field_0.v[1]);
              auVar44._0_4_ = -(uint)(fVar50 < tray.tfar.field_0.v[0]);
              auVar44._8_4_ = -(uint)(fVar56 < tray.tfar.field_0.v[2]);
              auVar44._12_4_ = -(uint)(fVar57 < tray.tfar.field_0.v[3]);
              uVar14 = movmskps(uVar14,auVar44);
              if (uVar14 != 0) {
                bVar1 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                uVar18 = (ulong)bVar1;
                pvVar3 = This->leafIntersector;
                valid_o.field_0._8_8_ = uVar10;
                valid_o.field_0._0_8_ = uVar9;
                uVar14 = movmskps((int)pRVar20,(undefined1  [16])terminated.field_0);
                uVar14 = uVar14 ^ 0xf;
                pRVar20 = (RayQueryContext *)(ulong)uVar14;
                if (uVar14 != 0) {
                  uVar23 = (ulong)(byte)uVar14;
                  do {
                    lVar4 = 0;
                    if (uVar23 != 0) {
                      for (; (uVar23 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                      }
                    }
                    pIVar22 = (Intersectors *)&pre;
                    cVar12 = (**(code **)((long)pvVar3 + (ulong)bVar1 * 0x40 + 0x18))
                                       (pIVar22,ray,lVar4,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    if (cVar12 != '\0') {
                      valid_o.field_0.i[lVar4] = -1;
                    }
                    uVar18 = uVar23 - 1;
                    uVar23 = uVar23 & uVar18;
                    pRVar20 = extraout_RDX;
                    aVar38 = _DAT_01f7a9f0;
                  } while (uVar23 != 0);
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     ((undefined1  [16])valid_o.field_0 | (undefined1  [16])vVar11.field_0);
                uVar14 = movmskps((int)uVar18,(undefined1  [16])terminated.field_0);
                if (uVar14 == 0xf) goto LAB_00240504;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                              (undefined1  [16])terminated.field_0);
              }
              goto LAB_0023fcc0;
            }
            uVar18 = root.ptr & 0xfffffffffffffff0;
            uVar14 = (uint)root.ptr & 7;
            sVar21 = 8;
            aVar127 = aVar38;
            do {
              sVar2 = *(size_t *)(uVar18 + 0x20 + (long)pRVar19 * 2);
              root.ptr = sVar21;
              aVar54 = aVar38;
              if (sVar2 == 8) break;
              if ((uVar14 == 6) || (uVar14 == 1)) {
                fVar58 = *(float *)((long)&pRVar19[6].scene + uVar18);
                fVar61 = *(float *)((long)&pRVar19[2].scene + uVar18);
                fVar63 = *(float *)((long)&pRVar19[2].args + uVar18);
                fVar65 = *(float *)((long)&pRVar19[3].user + uVar18);
                fVar67 = *(float *)((long)&pRVar19[4].scene + uVar18);
                auVar81 = *(undefined1 (*) [16])(ray + 0x70);
                fVar115 = auVar81._0_4_;
                fVar70 = auVar81._4_4_;
                fVar72 = auVar81._8_4_;
                fVar74 = auVar81._12_4_;
                fVar69 = *(float *)((long)&pRVar19[7].user + uVar18);
                fVar71 = *(float *)((long)&pRVar19[8].args + uVar18);
                fVar73 = *(float *)((long)&pRVar19[4].args + uVar18);
                fVar66 = *(float *)((long)&pRVar19[6].args + uVar18);
                fVar27 = *(float *)((long)&pRVar19[8].scene + uVar18);
                fVar28 = *(float *)((long)&pRVar19[9].user + uVar18);
                fVar46 = *(float *)((long)&pRVar19[5].user + uVar18);
                fVar47 = ((fVar58 * fVar115 + fVar61) - (float)tray.org.field_0._0_4_) *
                         (float)tray.rdir.field_0._0_4_;
                fVar107 = ((fVar58 * fVar70 + fVar61) - (float)tray.org.field_0._4_4_) *
                          (float)tray.rdir.field_0._4_4_;
                fVar112 = ((fVar58 * fVar72 + fVar61) - (float)tray.org.field_0._8_4_) *
                          (float)tray.rdir.field_0._8_4_;
                fVar58 = ((fVar58 * fVar74 + fVar61) - (float)tray.org.field_0._12_4_) *
                         (float)tray.rdir.field_0._12_4_;
                fVar76 = ((fVar69 * fVar115 + fVar65) - (float)tray.org.field_0._16_4_) *
                         (float)tray.rdir.field_0._16_4_;
                fVar77 = ((fVar69 * fVar70 + fVar65) - (float)tray.org.field_0._20_4_) *
                         (float)tray.rdir.field_0._20_4_;
                fVar78 = ((fVar69 * fVar72 + fVar65) - (float)tray.org.field_0._24_4_) *
                         (float)tray.rdir.field_0._24_4_;
                fVar79 = ((fVar69 * fVar74 + fVar65) - (float)tray.org.field_0._28_4_) *
                         (float)tray.rdir.field_0._28_4_;
                fVar61 = ((fVar71 * fVar115 + fVar73) - (float)tray.org.field_0._32_4_) *
                         tray.rdir.field_0._32_4_;
                fVar65 = ((fVar71 * fVar70 + fVar73) - (float)tray.org.field_0._36_4_) *
                         tray.rdir.field_0._36_4_;
                fVar69 = ((fVar71 * fVar72 + fVar73) - (float)tray.org.field_0._40_4_) *
                         tray.rdir.field_0._40_4_;
                fVar71 = ((fVar71 * fVar74 + fVar73) - (float)tray.org.field_0._44_4_) *
                         tray.rdir.field_0._44_4_;
                fVar80 = ((fVar66 * fVar115 + fVar63) - (float)tray.org.field_0._0_4_) *
                         (float)tray.rdir.field_0._0_4_;
                fVar82 = ((fVar66 * fVar70 + fVar63) - (float)tray.org.field_0._4_4_) *
                         (float)tray.rdir.field_0._4_4_;
                fVar83 = ((fVar66 * fVar72 + fVar63) - (float)tray.org.field_0._8_4_) *
                         (float)tray.rdir.field_0._8_4_;
                fVar84 = ((fVar66 * fVar74 + fVar63) - (float)tray.org.field_0._12_4_) *
                         (float)tray.rdir.field_0._12_4_;
                fVar86 = ((fVar27 * fVar115 + fVar67) - (float)tray.org.field_0._16_4_) *
                         (float)tray.rdir.field_0._16_4_;
                fVar88 = ((fVar27 * fVar70 + fVar67) - (float)tray.org.field_0._20_4_) *
                         (float)tray.rdir.field_0._20_4_;
                fVar89 = ((fVar27 * fVar72 + fVar67) - (float)tray.org.field_0._24_4_) *
                         (float)tray.rdir.field_0._24_4_;
                fVar27 = ((fVar27 * fVar74 + fVar67) - (float)tray.org.field_0._28_4_) *
                         (float)tray.rdir.field_0._28_4_;
                fVar63 = ((fVar28 * fVar115 + fVar46) - (float)tray.org.field_0._32_4_) *
                         tray.rdir.field_0._32_4_;
                fVar67 = ((fVar28 * fVar70 + fVar46) - (float)tray.org.field_0._36_4_) *
                         tray.rdir.field_0._36_4_;
                fVar73 = ((fVar28 * fVar72 + fVar46) - (float)tray.org.field_0._40_4_) *
                         tray.rdir.field_0._40_4_;
                fVar66 = ((fVar28 * fVar74 + fVar46) - (float)tray.org.field_0._44_4_) *
                         tray.rdir.field_0._44_4_;
                uVar15 = (uint)((int)fVar80 < (int)fVar47) * (int)fVar80 |
                         (uint)((int)fVar80 >= (int)fVar47) * (int)fVar47;
                uVar90 = (uint)((int)fVar82 < (int)fVar107) * (int)fVar82 |
                         (uint)((int)fVar82 >= (int)fVar107) * (int)fVar107;
                uVar91 = (uint)((int)fVar83 < (int)fVar112) * (int)fVar83 |
                         (uint)((int)fVar83 >= (int)fVar112) * (int)fVar112;
                uVar92 = (uint)((int)fVar84 < (int)fVar58) * (int)fVar84 |
                         (uint)((int)fVar84 >= (int)fVar58) * (int)fVar58;
                uVar93 = (uint)((int)fVar86 < (int)fVar76) * (int)fVar86 |
                         (uint)((int)fVar86 >= (int)fVar76) * (int)fVar76;
                uVar94 = (uint)((int)fVar88 < (int)fVar77) * (int)fVar88 |
                         (uint)((int)fVar88 >= (int)fVar77) * (int)fVar77;
                uVar95 = (uint)((int)fVar89 < (int)fVar78) * (int)fVar89 |
                         (uint)((int)fVar89 >= (int)fVar78) * (int)fVar78;
                uVar96 = (uint)((int)fVar27 < (int)fVar79) * (int)fVar27 |
                         (uint)((int)fVar27 >= (int)fVar79) * (int)fVar79;
                uVar15 = ((int)uVar93 < (int)uVar15) * uVar15 |
                         ((int)uVar93 >= (int)uVar15) * uVar93;
                uVar90 = ((int)uVar94 < (int)uVar90) * uVar90 |
                         ((int)uVar94 >= (int)uVar90) * uVar94;
                uVar91 = ((int)uVar95 < (int)uVar91) * uVar91 |
                         ((int)uVar95 >= (int)uVar91) * uVar95;
                uVar92 = ((int)uVar96 < (int)uVar92) * uVar92 |
                         ((int)uVar96 >= (int)uVar92) * uVar96;
                uVar93 = (uint)((int)fVar63 < (int)fVar61) * (int)fVar63 |
                         (uint)((int)fVar63 >= (int)fVar61) * (int)fVar61;
                uVar94 = (uint)((int)fVar67 < (int)fVar65) * (int)fVar67 |
                         (uint)((int)fVar67 >= (int)fVar65) * (int)fVar65;
                uVar95 = (uint)((int)fVar73 < (int)fVar69) * (int)fVar73 |
                         (uint)((int)fVar73 >= (int)fVar69) * (int)fVar69;
                uVar96 = (uint)((int)fVar66 < (int)fVar71) * (int)fVar66 |
                         (uint)((int)fVar66 >= (int)fVar71) * (int)fVar71;
                auVar100._0_4_ =
                     (float)(((int)uVar93 < (int)uVar15) * uVar15 |
                            ((int)uVar93 >= (int)uVar15) * uVar93) * 0.99999964;
                auVar100._4_4_ =
                     (float)(((int)uVar94 < (int)uVar90) * uVar90 |
                            ((int)uVar94 >= (int)uVar90) * uVar94) * 0.99999964;
                auVar100._8_4_ =
                     (float)(((int)uVar95 < (int)uVar91) * uVar91 |
                            ((int)uVar95 >= (int)uVar91) * uVar95) * 0.99999964;
                auVar100._12_4_ =
                     (float)(((int)uVar96 < (int)uVar92) * uVar92 |
                            ((int)uVar96 >= (int)uVar92) * uVar96) * 0.99999964;
                uVar15 = (uint)((int)fVar80 < (int)fVar47) * (int)fVar47 |
                         (uint)((int)fVar80 >= (int)fVar47) * (int)fVar80;
                uVar90 = (uint)((int)fVar82 < (int)fVar107) * (int)fVar107 |
                         (uint)((int)fVar82 >= (int)fVar107) * (int)fVar82;
                uVar91 = (uint)((int)fVar83 < (int)fVar112) * (int)fVar112 |
                         (uint)((int)fVar83 >= (int)fVar112) * (int)fVar83;
                uVar92 = (uint)((int)fVar84 < (int)fVar58) * (int)fVar58 |
                         (uint)((int)fVar84 >= (int)fVar58) * (int)fVar84;
                uVar93 = (uint)((int)fVar86 < (int)fVar76) * (int)fVar76 |
                         (uint)((int)fVar86 >= (int)fVar76) * (int)fVar86;
                uVar94 = (uint)((int)fVar88 < (int)fVar77) * (int)fVar77 |
                         (uint)((int)fVar88 >= (int)fVar77) * (int)fVar88;
                uVar95 = (uint)((int)fVar89 < (int)fVar78) * (int)fVar78 |
                         (uint)((int)fVar89 >= (int)fVar78) * (int)fVar89;
                uVar96 = (uint)((int)fVar27 < (int)fVar79) * (int)fVar79 |
                         (uint)((int)fVar27 >= (int)fVar79) * (int)fVar27;
                uVar93 = ((int)uVar15 < (int)uVar93) * uVar15 |
                         ((int)uVar15 >= (int)uVar93) * uVar93;
                uVar94 = ((int)uVar90 < (int)uVar94) * uVar90 |
                         ((int)uVar90 >= (int)uVar94) * uVar94;
                uVar95 = ((int)uVar91 < (int)uVar95) * uVar91 |
                         ((int)uVar91 >= (int)uVar95) * uVar95;
                uVar96 = ((int)uVar92 < (int)uVar96) * uVar92 |
                         ((int)uVar92 >= (int)uVar96) * uVar96;
                uVar15 = (uint)((int)fVar63 < (int)fVar61) * (int)fVar61 |
                         (uint)((int)fVar63 >= (int)fVar61) * (int)fVar63;
                uVar90 = (uint)((int)fVar67 < (int)fVar65) * (int)fVar65 |
                         (uint)((int)fVar67 >= (int)fVar65) * (int)fVar67;
                uVar91 = (uint)((int)fVar73 < (int)fVar69) * (int)fVar69 |
                         (uint)((int)fVar73 >= (int)fVar69) * (int)fVar73;
                uVar92 = (uint)((int)fVar66 < (int)fVar71) * (int)fVar71 |
                         (uint)((int)fVar66 >= (int)fVar71) * (int)fVar66;
                fVar58 = (float)(((int)uVar93 < (int)uVar15) * uVar93 |
                                ((int)uVar93 >= (int)uVar15) * uVar15) * 1.0000004;
                fVar61 = (float)(((int)uVar94 < (int)uVar90) * uVar94 |
                                ((int)uVar94 >= (int)uVar90) * uVar90) * 1.0000004;
                fVar63 = (float)(((int)uVar95 < (int)uVar91) * uVar95 |
                                ((int)uVar95 >= (int)uVar91) * uVar91) * 1.0000004;
                fVar65 = (float)(((int)uVar96 < (int)uVar92) * uVar96 |
                                ((int)uVar96 >= (int)uVar92) * uVar92) * 1.0000004;
                bVar13 = (float)((uint)(tray.tnear.field_0.i[0] < (int)auVar100._0_4_) *
                                 (int)auVar100._0_4_ |
                                (uint)(tray.tnear.field_0.i[0] >= (int)auVar100._0_4_) *
                                tray.tnear.field_0.i[0]) <=
                         (float)((uint)(tray.tfar.field_0.i[0] < (int)fVar58) *
                                 tray.tfar.field_0.i[0] |
                                (uint)(tray.tfar.field_0.i[0] >= (int)fVar58) * (int)fVar58);
                uVar15 = -(uint)bVar13;
                bVar5 = (float)((uint)(tray.tnear.field_0.i[1] < (int)auVar100._4_4_) *
                                (int)auVar100._4_4_ |
                               (uint)(tray.tnear.field_0.i[1] >= (int)auVar100._4_4_) *
                               tray.tnear.field_0.i[1]) <=
                        (float)((uint)(tray.tfar.field_0.i[1] < (int)fVar61) *
                                tray.tfar.field_0.i[1] |
                               (uint)(tray.tfar.field_0.i[1] >= (int)fVar61) * (int)fVar61);
                uVar90 = -(uint)bVar5;
                bVar6 = (float)((uint)(tray.tnear.field_0.i[2] < (int)auVar100._8_4_) *
                                (int)auVar100._8_4_ |
                               (uint)(tray.tnear.field_0.i[2] >= (int)auVar100._8_4_) *
                               tray.tnear.field_0.i[2]) <=
                        (float)((uint)(tray.tfar.field_0.i[2] < (int)fVar63) *
                                tray.tfar.field_0.i[2] |
                               (uint)(tray.tfar.field_0.i[2] >= (int)fVar63) * (int)fVar63);
                uVar91 = -(uint)bVar6;
                bVar7 = (float)((uint)(tray.tnear.field_0.i[3] < (int)auVar100._12_4_) *
                                (int)auVar100._12_4_ |
                               (uint)(tray.tnear.field_0.i[3] >= (int)auVar100._12_4_) *
                               tray.tnear.field_0.i[3]) <=
                        (float)((uint)(tray.tfar.field_0.i[3] < (int)fVar65) *
                                tray.tfar.field_0.i[3] |
                               (uint)(tray.tfar.field_0.i[3] >= (int)fVar65) * (int)fVar65);
                uVar92 = -(uint)bVar7;
                if (uVar14 == 6) {
                  fVar58 = *(float *)((long)&pRVar19[10].scene + uVar18);
                  fVar61 = *(float *)((long)&pRVar19[10].args + uVar18);
                  uVar15 = -(uint)((fVar115 < fVar61 && fVar58 <= fVar115) && bVar13);
                  uVar90 = -(uint)((fVar70 < fVar61 && fVar58 <= fVar70) && bVar5);
                  uVar91 = -(uint)((fVar72 < fVar61 && fVar58 <= fVar72) && bVar6);
                  uVar92 = -(uint)((fVar74 < fVar61 && fVar58 <= fVar74) && bVar7);
                }
              }
              else {
                fVar58 = *(float *)((long)&pRVar19[2].scene + uVar18);
                fVar61 = *(float *)((long)&pRVar19[4].scene + uVar18);
                fVar63 = *(float *)((long)&pRVar19[4].args + uVar18);
                fVar65 = *(float *)((long)&pRVar19[6].scene + uVar18);
                fVar67 = *(float *)((long)&pRVar19[6].args + uVar18);
                fVar69 = *(float *)((long)&pRVar19[10].scene + uVar18);
                fVar71 = *(float *)((long)&pRVar19[10].args + uVar18);
                fVar73 = *(float *)((long)&pRVar19[0xb].user + uVar18);
                fVar66 = *(float *)((long)&pRVar19[0xc].scene + uVar18);
                fVar27 = *(float *)((long)&pRVar19[0xc].args + uVar18);
                fVar28 = *(float *)((long)&pRVar19[0xd].user + uVar18);
                fVar74 = *(float *)(ray + 0x70);
                fVar76 = *(float *)(ray + 0x74);
                fVar77 = *(float *)(ray + 0x78);
                fVar78 = *(float *)(ray + 0x7c);
                fVar108 = 1.0 - fVar74;
                fVar113 = 1.0 - fVar76;
                fVar116 = 1.0 - fVar77;
                fVar118 = 1.0 - fVar78;
                fVar109 = fVar108 * 0.0;
                fVar114 = fVar113 * 0.0;
                fVar117 = fVar116 * 0.0;
                fVar119 = fVar118 * 0.0;
                auVar52._0_4_ =
                     fVar58 * (float)tray.dir.field_0._0_4_ +
                     fVar61 * (float)tray.dir.field_0._16_4_ +
                     fVar65 * (float)tray.dir.field_0._32_4_;
                auVar52._4_4_ =
                     fVar58 * (float)tray.dir.field_0._4_4_ +
                     fVar61 * (float)tray.dir.field_0._20_4_ +
                     fVar65 * (float)tray.dir.field_0._36_4_;
                auVar52._8_4_ =
                     fVar58 * (float)tray.dir.field_0._8_4_ +
                     fVar61 * (float)tray.dir.field_0._24_4_ +
                     fVar65 * (float)tray.dir.field_0._40_4_;
                auVar52._12_4_ =
                     fVar58 * (float)tray.dir.field_0._12_4_ +
                     fVar61 * (float)tray.dir.field_0._28_4_ +
                     fVar65 * (float)tray.dir.field_0._44_4_;
                fVar46 = *(float *)((long)&pRVar19[2].args + uVar18);
                auVar128._0_4_ =
                     fVar46 * (float)tray.dir.field_0._0_4_ +
                     fVar63 * (float)tray.dir.field_0._16_4_ +
                     fVar67 * (float)tray.dir.field_0._32_4_;
                auVar128._4_4_ =
                     fVar46 * (float)tray.dir.field_0._4_4_ +
                     fVar63 * (float)tray.dir.field_0._20_4_ +
                     fVar67 * (float)tray.dir.field_0._36_4_;
                auVar128._8_4_ =
                     fVar46 * (float)tray.dir.field_0._8_4_ +
                     fVar63 * (float)tray.dir.field_0._24_4_ +
                     fVar67 * (float)tray.dir.field_0._40_4_;
                auVar128._12_4_ =
                     fVar46 * (float)tray.dir.field_0._12_4_ +
                     fVar63 * (float)tray.dir.field_0._28_4_ +
                     fVar67 * (float)tray.dir.field_0._44_4_;
                fVar115 = (float)DAT_01f80d30;
                fVar70 = DAT_01f80d30._4_4_;
                fVar72 = DAT_01f80d30._8_4_;
                fVar79 = DAT_01f80d30._12_4_;
                auVar39._4_4_ = -(uint)(ABS(auVar52._4_4_) < fVar70);
                auVar39._0_4_ = -(uint)(ABS(auVar52._0_4_) < fVar115);
                auVar39._8_4_ = -(uint)(ABS(auVar52._8_4_) < fVar72);
                auVar39._12_4_ = -(uint)(ABS(auVar52._12_4_) < fVar79);
                auVar68 = blendvps(auVar52,_DAT_01f80d30,auVar39);
                auVar40._4_4_ = -(uint)(ABS(auVar128._4_4_) < fVar70);
                auVar40._0_4_ = -(uint)(ABS(auVar128._0_4_) < fVar115);
                auVar40._8_4_ = -(uint)(ABS(auVar128._8_4_) < fVar72);
                auVar40._12_4_ = -(uint)(ABS(auVar128._12_4_) < fVar79);
                auVar87 = blendvps(auVar128,_DAT_01f80d30,auVar40);
                fVar47 = *(float *)((long)&pRVar19[5].user + uVar18);
                fVar107 = *(float *)((long)&pRVar19[7].user + uVar18);
                fVar112 = *(float *)((long)&pRVar19[3].user + uVar18);
                auVar60._0_4_ =
                     (float)tray.dir.field_0._0_4_ * fVar112 +
                     (float)tray.dir.field_0._16_4_ * fVar47 +
                     (float)tray.dir.field_0._32_4_ * fVar107;
                auVar60._4_4_ =
                     (float)tray.dir.field_0._4_4_ * fVar112 +
                     (float)tray.dir.field_0._20_4_ * fVar47 +
                     (float)tray.dir.field_0._36_4_ * fVar107;
                auVar60._8_4_ =
                     (float)tray.dir.field_0._8_4_ * fVar112 +
                     (float)tray.dir.field_0._24_4_ * fVar47 +
                     (float)tray.dir.field_0._40_4_ * fVar107;
                auVar60._12_4_ =
                     (float)tray.dir.field_0._12_4_ * fVar112 +
                     (float)tray.dir.field_0._28_4_ * fVar47 +
                     (float)tray.dir.field_0._44_4_ * fVar107;
                auVar41._4_4_ = -(uint)(ABS(auVar60._4_4_) < fVar70);
                auVar41._0_4_ = -(uint)(ABS(auVar60._0_4_) < fVar115);
                auVar41._8_4_ = -(uint)(ABS(auVar60._8_4_) < fVar72);
                auVar41._12_4_ = -(uint)(ABS(auVar60._12_4_) < fVar79);
                auVar98 = blendvps(auVar60,_DAT_01f80d30,auVar41);
                auVar81 = rcpps(auVar41,auVar68);
                fVar79 = auVar81._0_4_;
                auVar53._0_4_ = auVar68._0_4_ * fVar79;
                fVar83 = auVar81._4_4_;
                auVar53._4_4_ = auVar68._4_4_ * fVar83;
                fVar88 = auVar81._8_4_;
                auVar53._8_4_ = auVar68._8_4_ * fVar88;
                fVar85 = auVar81._12_4_;
                auVar53._12_4_ = auVar68._12_4_ * fVar85;
                fVar79 = (1.0 - auVar53._0_4_) * fVar79 + fVar79;
                fVar83 = (1.0 - auVar53._4_4_) * fVar83 + fVar83;
                fVar88 = (1.0 - auVar53._8_4_) * fVar88 + fVar88;
                fVar85 = (1.0 - auVar53._12_4_) * fVar85 + fVar85;
                auVar81 = rcpps(auVar81,auVar87);
                fVar80 = auVar81._0_4_;
                fVar84 = auVar81._4_4_;
                fVar89 = auVar81._8_4_;
                fVar75 = auVar81._12_4_;
                fVar80 = (1.0 - auVar87._0_4_ * fVar80) * fVar80 + fVar80;
                fVar84 = (1.0 - auVar87._4_4_ * fVar84) * fVar84 + fVar84;
                fVar89 = (1.0 - auVar87._8_4_ * fVar89) * fVar89 + fVar89;
                fVar75 = (1.0 - auVar87._12_4_ * fVar75) * fVar75 + fVar75;
                auVar81 = rcpps(auVar53,auVar98);
                fVar82 = auVar81._0_4_;
                fVar86 = auVar81._4_4_;
                fVar48 = auVar81._8_4_;
                fVar49 = auVar81._12_4_;
                fVar82 = (1.0 - auVar98._0_4_ * fVar82) * fVar82 + fVar82;
                fVar86 = (1.0 - auVar98._4_4_ * fVar86) * fVar86 + fVar86;
                fVar48 = (1.0 - auVar98._8_4_ * fVar48) * fVar48 + fVar48;
                fVar49 = (1.0 - auVar98._12_4_ * fVar49) * fVar49 + fVar49;
                fVar115 = *(float *)((long)&pRVar19[8].scene + uVar18);
                fVar70 = *(float *)((long)&pRVar19[8].args + uVar18);
                fVar72 = *(float *)((long)&pRVar19[9].user + uVar18);
                fVar59 = fVar58 * (float)tray.org.field_0._0_4_ +
                         fVar61 * (float)tray.org.field_0._16_4_ +
                         fVar65 * (float)tray.org.field_0._32_4_ + fVar115;
                fVar62 = fVar58 * (float)tray.org.field_0._4_4_ +
                         fVar61 * (float)tray.org.field_0._20_4_ +
                         fVar65 * (float)tray.org.field_0._36_4_ + fVar115;
                fVar64 = fVar58 * (float)tray.org.field_0._8_4_ +
                         fVar61 * (float)tray.org.field_0._24_4_ +
                         fVar65 * (float)tray.org.field_0._40_4_ + fVar115;
                fVar115 = fVar58 * (float)tray.org.field_0._12_4_ +
                          fVar61 * (float)tray.org.field_0._28_4_ +
                          fVar65 * (float)tray.org.field_0._44_4_ + fVar115;
                fVar104 = fVar46 * (float)tray.org.field_0._0_4_ +
                          fVar63 * (float)tray.org.field_0._16_4_ +
                          fVar67 * (float)tray.org.field_0._32_4_ + fVar70;
                fVar105 = fVar46 * (float)tray.org.field_0._4_4_ +
                          fVar63 * (float)tray.org.field_0._20_4_ +
                          fVar67 * (float)tray.org.field_0._36_4_ + fVar70;
                fVar106 = fVar46 * (float)tray.org.field_0._8_4_ +
                          fVar63 * (float)tray.org.field_0._24_4_ +
                          fVar67 * (float)tray.org.field_0._40_4_ + fVar70;
                fVar67 = fVar46 * (float)tray.org.field_0._12_4_ +
                         fVar63 * (float)tray.org.field_0._28_4_ +
                         fVar67 * (float)tray.org.field_0._44_4_ + fVar70;
                fVar70 = fVar112 * (float)tray.org.field_0._0_4_ +
                         fVar47 * (float)tray.org.field_0._16_4_ +
                         fVar107 * (float)tray.org.field_0._32_4_ + fVar72;
                fVar129 = fVar112 * (float)tray.org.field_0._4_4_ +
                          fVar47 * (float)tray.org.field_0._20_4_ +
                          fVar107 * (float)tray.org.field_0._36_4_ + fVar72;
                fVar130 = fVar112 * (float)tray.org.field_0._8_4_ +
                          fVar47 * (float)tray.org.field_0._24_4_ +
                          fVar107 * (float)tray.org.field_0._40_4_ + fVar72;
                fVar112 = fVar112 * (float)tray.org.field_0._12_4_ +
                          fVar47 * (float)tray.org.field_0._28_4_ +
                          fVar107 * (float)tray.org.field_0._44_4_ + fVar72;
                fVar58 = ((fVar69 * fVar74 + fVar109) - fVar59) * fVar79;
                fVar61 = ((fVar69 * fVar76 + fVar114) - fVar62) * fVar83;
                fVar63 = ((fVar69 * fVar77 + fVar117) - fVar64) * fVar88;
                fVar65 = ((fVar69 * fVar78 + fVar119) - fVar115) * fVar85;
                fVar79 = ((fVar66 * fVar74 + fVar108) - fVar59) * fVar79;
                fVar83 = ((fVar66 * fVar76 + fVar113) - fVar62) * fVar83;
                fVar88 = ((fVar66 * fVar77 + fVar116) - fVar64) * fVar88;
                fVar85 = ((fVar66 * fVar78 + fVar118) - fVar115) * fVar85;
                fVar66 = ((fVar71 * fVar74 + fVar109) - fVar104) * fVar80;
                fVar46 = ((fVar71 * fVar76 + fVar114) - fVar105) * fVar84;
                fVar47 = ((fVar71 * fVar77 + fVar117) - fVar106) * fVar89;
                fVar107 = ((fVar71 * fVar78 + fVar119) - fVar67) * fVar75;
                fVar80 = ((fVar27 * fVar74 + fVar108) - fVar104) * fVar80;
                fVar84 = ((fVar27 * fVar76 + fVar113) - fVar105) * fVar84;
                fVar89 = ((fVar27 * fVar77 + fVar116) - fVar106) * fVar89;
                fVar75 = ((fVar27 * fVar78 + fVar118) - fVar67) * fVar75;
                fVar67 = ((fVar109 + fVar73 * fVar74) - fVar70) * fVar82;
                fVar69 = ((fVar114 + fVar73 * fVar76) - fVar129) * fVar86;
                fVar71 = ((fVar117 + fVar73 * fVar77) - fVar130) * fVar48;
                fVar73 = ((fVar119 + fVar73 * fVar78) - fVar112) * fVar49;
                fVar82 = ((fVar28 * fVar74 + fVar108) - fVar70) * fVar82;
                fVar86 = ((fVar28 * fVar76 + fVar113) - fVar129) * fVar86;
                fVar48 = ((fVar28 * fVar77 + fVar116) - fVar130) * fVar48;
                fVar49 = ((fVar28 * fVar78 + fVar118) - fVar112) * fVar49;
                uVar15 = (uint)((int)fVar79 < (int)fVar58) * (int)fVar79 |
                         (uint)((int)fVar79 >= (int)fVar58) * (int)fVar58;
                uVar90 = (uint)((int)fVar83 < (int)fVar61) * (int)fVar83 |
                         (uint)((int)fVar83 >= (int)fVar61) * (int)fVar61;
                uVar91 = (uint)((int)fVar88 < (int)fVar63) * (int)fVar88 |
                         (uint)((int)fVar88 >= (int)fVar63) * (int)fVar63;
                uVar92 = (uint)((int)fVar85 < (int)fVar65) * (int)fVar85 |
                         (uint)((int)fVar85 >= (int)fVar65) * (int)fVar65;
                uVar93 = (uint)((int)fVar80 < (int)fVar66) * (int)fVar80 |
                         (uint)((int)fVar80 >= (int)fVar66) * (int)fVar66;
                uVar94 = (uint)((int)fVar84 < (int)fVar46) * (int)fVar84 |
                         (uint)((int)fVar84 >= (int)fVar46) * (int)fVar46;
                uVar95 = (uint)((int)fVar89 < (int)fVar47) * (int)fVar89 |
                         (uint)((int)fVar89 >= (int)fVar47) * (int)fVar47;
                uVar96 = (uint)((int)fVar75 < (int)fVar107) * (int)fVar75 |
                         (uint)((int)fVar75 >= (int)fVar107) * (int)fVar107;
                uVar15 = ((int)uVar93 < (int)uVar15) * uVar15 |
                         ((int)uVar93 >= (int)uVar15) * uVar93;
                uVar90 = ((int)uVar94 < (int)uVar90) * uVar90 |
                         ((int)uVar94 >= (int)uVar90) * uVar94;
                uVar91 = ((int)uVar95 < (int)uVar91) * uVar91 |
                         ((int)uVar95 >= (int)uVar91) * uVar95;
                uVar92 = ((int)uVar96 < (int)uVar92) * uVar92 |
                         ((int)uVar96 >= (int)uVar92) * uVar96;
                uVar97 = (uint)((int)fVar82 < (int)fVar67) * (int)fVar82 |
                         (uint)((int)fVar82 >= (int)fVar67) * (int)fVar67;
                uVar101 = (uint)((int)fVar86 < (int)fVar69) * (int)fVar86 |
                          (uint)((int)fVar86 >= (int)fVar69) * (int)fVar69;
                uVar102 = (uint)((int)fVar48 < (int)fVar71) * (int)fVar48 |
                          (uint)((int)fVar48 >= (int)fVar71) * (int)fVar71;
                uVar103 = (uint)((int)fVar49 < (int)fVar73) * (int)fVar49 |
                          (uint)((int)fVar49 >= (int)fVar73) * (int)fVar73;
                uVar120 = (uint)((int)fVar79 < (int)fVar58) * (int)fVar58 |
                          (uint)((int)fVar79 >= (int)fVar58) * (int)fVar79;
                uVar122 = (uint)((int)fVar83 < (int)fVar61) * (int)fVar61 |
                          (uint)((int)fVar83 >= (int)fVar61) * (int)fVar83;
                uVar123 = (uint)((int)fVar88 < (int)fVar63) * (int)fVar63 |
                          (uint)((int)fVar88 >= (int)fVar63) * (int)fVar88;
                uVar124 = (uint)((int)fVar85 < (int)fVar65) * (int)fVar65 |
                          (uint)((int)fVar85 >= (int)fVar65) * (int)fVar85;
                uVar93 = (uint)((int)fVar80 < (int)fVar66) * (int)fVar66 |
                         (uint)((int)fVar80 >= (int)fVar66) * (int)fVar80;
                uVar94 = (uint)((int)fVar84 < (int)fVar46) * (int)fVar46 |
                         (uint)((int)fVar84 >= (int)fVar46) * (int)fVar84;
                uVar95 = (uint)((int)fVar89 < (int)fVar47) * (int)fVar47 |
                         (uint)((int)fVar89 >= (int)fVar47) * (int)fVar89;
                uVar96 = (uint)((int)fVar75 < (int)fVar107) * (int)fVar107 |
                         (uint)((int)fVar75 >= (int)fVar107) * (int)fVar75;
                uVar120 = ((int)uVar120 < (int)uVar93) * uVar120 |
                          ((int)uVar120 >= (int)uVar93) * uVar93;
                uVar122 = ((int)uVar122 < (int)uVar94) * uVar122 |
                          ((int)uVar122 >= (int)uVar94) * uVar94;
                uVar123 = ((int)uVar123 < (int)uVar95) * uVar123 |
                          ((int)uVar123 >= (int)uVar95) * uVar95;
                uVar124 = ((int)uVar124 < (int)uVar96) * uVar124 |
                          ((int)uVar124 >= (int)uVar96) * uVar96;
                uVar93 = (uint)((int)fVar82 < (int)fVar67) * (int)fVar67 |
                         (uint)((int)fVar82 >= (int)fVar67) * (int)fVar82;
                uVar94 = (uint)((int)fVar86 < (int)fVar69) * (int)fVar69 |
                         (uint)((int)fVar86 >= (int)fVar69) * (int)fVar86;
                uVar95 = (uint)((int)fVar48 < (int)fVar71) * (int)fVar71 |
                         (uint)((int)fVar48 >= (int)fVar71) * (int)fVar48;
                uVar96 = (uint)((int)fVar49 < (int)fVar73) * (int)fVar73 |
                         (uint)((int)fVar49 >= (int)fVar73) * (int)fVar49;
                auVar100._0_4_ =
                     (float)(((int)uVar97 < (int)uVar15) * uVar15 |
                            ((int)uVar97 >= (int)uVar15) * uVar97) * 0.99999964;
                auVar100._4_4_ =
                     (float)(((int)uVar101 < (int)uVar90) * uVar90 |
                            ((int)uVar101 >= (int)uVar90) * uVar101) * 0.99999964;
                auVar100._8_4_ =
                     (float)(((int)uVar102 < (int)uVar91) * uVar91 |
                            ((int)uVar102 >= (int)uVar91) * uVar102) * 0.99999964;
                auVar100._12_4_ =
                     (float)(((int)uVar103 < (int)uVar92) * uVar92 |
                            ((int)uVar103 >= (int)uVar92) * uVar103) * 0.99999964;
                fVar58 = (float)(((int)uVar120 < (int)uVar93) * uVar120 |
                                ((int)uVar120 >= (int)uVar93) * uVar93) * 1.0000004;
                fVar61 = (float)(((int)uVar122 < (int)uVar94) * uVar122 |
                                ((int)uVar122 >= (int)uVar94) * uVar94) * 1.0000004;
                fVar63 = (float)(((int)uVar123 < (int)uVar95) * uVar123 |
                                ((int)uVar123 >= (int)uVar95) * uVar95) * 1.0000004;
                fVar65 = (float)(((int)uVar124 < (int)uVar96) * uVar124 |
                                ((int)uVar124 >= (int)uVar96) * uVar96) * 1.0000004;
                uVar15 = -(uint)((float)((uint)(tray.tnear.field_0.i[0] < (int)auVar100._0_4_) *
                                         (int)auVar100._0_4_ |
                                        (uint)(tray.tnear.field_0.i[0] >= (int)auVar100._0_4_) *
                                        tray.tnear.field_0.i[0]) <=
                                (float)((uint)(tray.tfar.field_0.i[0] < (int)fVar58) *
                                        tray.tfar.field_0.i[0] |
                                       (uint)(tray.tfar.field_0.i[0] >= (int)fVar58) * (int)fVar58))
                ;
                uVar90 = -(uint)((float)((uint)(tray.tnear.field_0.i[1] < (int)auVar100._4_4_) *
                                         (int)auVar100._4_4_ |
                                        (uint)(tray.tnear.field_0.i[1] >= (int)auVar100._4_4_) *
                                        tray.tnear.field_0.i[1]) <=
                                (float)((uint)(tray.tfar.field_0.i[1] < (int)fVar61) *
                                        tray.tfar.field_0.i[1] |
                                       (uint)(tray.tfar.field_0.i[1] >= (int)fVar61) * (int)fVar61))
                ;
                uVar91 = -(uint)((float)((uint)(tray.tnear.field_0.i[2] < (int)auVar100._8_4_) *
                                         (int)auVar100._8_4_ |
                                        (uint)(tray.tnear.field_0.i[2] >= (int)auVar100._8_4_) *
                                        tray.tnear.field_0.i[2]) <=
                                (float)((uint)(tray.tfar.field_0.i[2] < (int)fVar63) *
                                        tray.tfar.field_0.i[2] |
                                       (uint)(tray.tfar.field_0.i[2] >= (int)fVar63) * (int)fVar63))
                ;
                uVar92 = -(uint)((float)((uint)(tray.tnear.field_0.i[3] < (int)auVar100._12_4_) *
                                         (int)auVar100._12_4_ |
                                        (uint)(tray.tnear.field_0.i[3] >= (int)auVar100._12_4_) *
                                        tray.tnear.field_0.i[3]) <=
                                (float)((uint)(tray.tfar.field_0.i[3] < (int)fVar65) *
                                        tray.tfar.field_0.i[3] |
                                       (uint)(tray.tfar.field_0.i[3] >= (int)fVar65) * (int)fVar65))
                ;
                aVar127 = _DAT_01f7a9f0;
              }
              auVar42._0_4_ = (uVar15 & -(uint)(fVar50 < tray.tfar.field_0.v[0])) << 0x1f;
              auVar42._4_4_ = (uVar90 & -(uint)(fVar55 < tray.tfar.field_0.v[1])) << 0x1f;
              auVar42._8_4_ = (uVar91 & -(uint)(fVar56 < tray.tfar.field_0.v[2])) << 0x1f;
              auVar42._12_4_ = (uVar92 & -(uint)(fVar57 < tray.tfar.field_0.v[3])) << 0x1f;
              uVar15 = movmskps((int)pIVar22,auVar42);
              pIVar22 = (Intersectors *)(ulong)uVar15;
              if ((uVar15 != 0) &&
                 (aVar54.v = (__m128)blendvps(aVar127.v,auVar100,auVar42), root.ptr = sVar2,
                 sVar21 != 8)) {
                pNVar25->ptr = sVar21;
                pNVar25 = pNVar25 + 1;
                local_1958 = aVar38._0_8_;
                uStack_1950 = aVar38._8_8_;
                *(undefined8 *)paVar24 = local_1958;
                *(undefined8 *)(paVar24->v + 2) = uStack_1950;
                paVar24 = paVar24 + 1;
              }
              aVar38 = aVar54;
              pRVar19 = (RayQueryContext *)((long)&pRVar19->scene + 4);
              sVar21 = root.ptr;
              aVar54 = aVar38;
            } while (pRVar19 != (RayQueryContext *)0x0);
            pRVar20 = pRVar19;
            aVar38 = aVar127;
            if (root.ptr == 8) goto LAB_00240330;
            auVar43._4_4_ = -(uint)(aVar54.v[1] < tray.tfar.field_0.v[1]);
            auVar43._0_4_ = -(uint)(aVar54.v[0] < tray.tfar.field_0.v[0]);
            auVar43._8_4_ = -(uint)(aVar54.v[2] < tray.tfar.field_0.v[2]);
            auVar43._12_4_ = -(uint)(aVar54.v[3] < tray.tfar.field_0.v[3]);
            uVar16 = movmskps((int)uVar18,auVar43);
            uVar14 = POPCOUNT(uVar16);
          } while ((byte)uVar17 < (byte)uVar14);
          pNVar25->ptr = root.ptr;
          pNVar25 = pNVar25 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar24->v = aVar54;
          paVar24 = paVar24 + 1;
LAB_00240330:
          uVar14 = 4;
        }
        else {
          do {
            sVar21 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> sVar21 & 1) == 0; sVar21 = sVar21 + 1) {
              }
            }
            tray_00 = &tray;
            pIVar22 = This;
            pRVar20 = context;
            bVar13 = occluded1(This,bvh,root,sVar21,&pre,ray,tray_00,context);
            if (bVar13) {
              terminated.field_0.i[sVar21] = -1;
            }
            uVar18 = uVar18 & uVar18 - 1;
          } while (uVar18 != 0);
          iVar26 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
          uVar14 = 3;
          if (iVar26 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                          (undefined1  [16])terminated.field_0);
            uVar14 = 2;
          }
          aVar38 = _DAT_01f7a9f0;
          if (uVar17 < uVar15) goto LAB_0023fd00;
        }
      } while (uVar14 != 3);
LAB_00240504:
      auVar45._0_4_ = auVar51._0_4_ & terminated.field_0.i[0];
      auVar45._4_4_ = auVar51._4_4_ & terminated.field_0.i[1];
      auVar45._8_4_ = auVar51._8_4_ & terminated.field_0.i[2];
      auVar45._12_4_ = auVar51._12_4_ & terminated.field_0.i[3];
      auVar81 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f7aa00,auVar45);
      *(undefined1 (*) [16])(ray + 0x80) = auVar81;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }